

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_inv_txfm2d_add_8x4_sse41
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  __m128i *in;
  byte in_CL;
  __m128i *in_RDI;
  byte in_R8B;
  __m128i *buf1_cur;
  int in_stack_00000008;
  int i;
  __m128i *buf1_ptr;
  int32_t *input_row;
  __m128i buf0 [8];
  int lr_flip;
  int ud_flip;
  transform_1d_sse4_1 col_txfm;
  transform_1d_sse4_1 row_txfm;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [8];
  int in_stack_fffffffffffffe90;
  int size;
  __m128i *output_00;
  longlong local_158 [4];
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  uint16_t *in_stack_fffffffffffffed8;
  __m128i *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  __m128i *in_stack_ffffffffffffff08;
  __m128i *in_stack_ffffffffffffff10;
  int local_d8;
  int local_d4;
  transform_1d_sse4_1 local_d0;
  transform_1d_sse4_1 local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  char *local_b0;
  longlong local_a8 [18];
  byte local_16;
  byte local_15;
  __m128i *local_8;
  
  local_b0 = av1_inv_txfm_shift_ls[in_R8B];
  local_16 = in_R8B;
  local_15 = in_CL;
  local_8 = in_RDI;
  local_b4 = get_txw_idx(in_R8B);
  local_b8 = get_txh_idx(local_16);
  local_bc = tx_size_wide[local_16];
  local_c0 = tx_size_high[local_16];
  local_c8 = highbd_txfm_all_1d_zeros_w8_arr[local_b4][""[local_15]][1];
  local_d0 = highbd_txfm_all_1d_zeros_w8_arr[local_b8][""[local_15]][0];
  get_flip_cfg(local_15,&local_d4,&local_d8);
  load_buffer_32bit_input((int32_t *)local_8,4,(__m128i *)local_158,local_bc);
  av1_round_shift_rect_array_32_sse4_1
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
             in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  (*local_c8)((__m128i *)local_158,(__m128i *)local_158,0xc,0,in_stack_00000008,-(int)*local_b0);
  if (local_d8 == 0) {
    output_00 = (__m128i *)local_158;
  }
  else {
    flip_buf_sse2((__m128i *)local_158,(__m128i *)local_a8,local_bc);
    output_00 = (__m128i *)local_a8;
  }
  for (size = 0; size < 2; size = size + 1) {
    in = output_00 + size * local_c0;
    transpose_32bit_4x4(in,in);
    (*local_d0)(in,in,0xc,1,in_stack_00000008,0);
  }
  av1_round_shift_array_32_sse4_1(local_8,output_00,size,in_stack_fffffffffffffe90);
  highbd_write_buffer_8xn_sse4_1
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  return;
}

Assistant:

static void highbd_inv_txfm2d_add_8x4_sse41(const int32_t *input,
                                            uint16_t *output, int stride,
                                            TX_TYPE tx_type, TX_SIZE tx_size,
                                            int eob, const int bd) {
  (void)eob;
  __m128i buf1[8];
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const transform_1d_sse4_1 row_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][1];
  const transform_1d_sse4_1 col_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][0];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // 1st stage: column transform
  __m128i buf0[8];
  const int32_t *input_row = input;
  load_buffer_32bit_input(input_row, 4, buf0, txfm_size_col);

  av1_round_shift_rect_array_32_sse4_1(buf0, buf0, txfm_size_col, 0,
                                       NewInvSqrt2);
  row_txfm(buf0, buf0, INV_COS_BIT, 0, bd, -shift[0]);

  __m128i *buf1_ptr;
  if (lr_flip) {
    flip_buf_sse2(buf0, buf1, txfm_size_col);
    buf1_ptr = buf1;
  } else {
    buf1_ptr = buf0;
  }

  // 2nd stage: column transform
  for (int i = 0; i < 2; i++) {
    __m128i *buf1_cur = buf1_ptr + i * txfm_size_row;
    transpose_32bit_4x4(buf1_cur, buf1_cur);
    col_txfm(buf1_cur, buf1_cur, INV_COS_BIT, 1, bd, 0);
  }
  av1_round_shift_array_32_sse4_1(buf1_ptr, buf1_ptr, txfm_size_col, -shift[1]);
  // write to buffer
  highbd_write_buffer_8xn_sse4_1(buf1_ptr, output, stride, ud_flip,
                                 txfm_size_row, bd);
}